

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O0

DdNode * Llb_NonlinImageCompute(DdNode *bCurrent,int fReorder,int fDrop,int fVerbose,int *pOrder)

{
  Llb_Mgr_t *p;
  int iVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  abctime aVar5;
  DdNode *n;
  abctime clk2;
  abctime clk;
  int timeInside;
  int nReorders;
  int i;
  DdNode *bTemp;
  DdNode *bFunc;
  Llb_Prt_t *pPart2;
  Llb_Prt_t *pPart1;
  Llb_Prt_t *pPart;
  int *pOrder_local;
  int local_20;
  int fVerbose_local;
  int fDrop_local;
  int fReorder_local;
  DdNode *bCurrent_local;
  
  clk._4_4_ = 0;
  pPart = (Llb_Prt_t *)pOrder;
  pOrder_local._4_4_ = fVerbose;
  local_20 = fDrop;
  fVerbose_local = fReorder;
  _fDrop_local = bCurrent;
  aVar3 = Abc_Clock();
  p = ::p;
  iVar1 = ::p->iPartFree;
  ::p->iPartFree = iVar1 + 1;
  Llb_NonlinAddPartition(p,iVar1,_fDrop_local);
  for (timeInside = 0; timeInside < ::p->iPartFree; timeInside = timeInside + 1) {
    pPart1 = Llb_MgrPart(::p,timeInside);
    if ((pPart1 != (Llb_Prt_t *)0x0) && (iVar1 = Llb_NonlinHasSingletonVars(::p,pPart1), iVar1 != 0)
       ) {
      Llb_NonlinQuantify1(::p,pPart1,0);
    }
  }
  if (fVerbose_local != 0) {
    Llb_NonlinReorder(::p->dd,0,0);
  }
  memcpy(pPart,::p->dd->invperm,(long)::p->dd->size << 2);
  Llb_NonlinRecomputeScores(::p);
  while (iVar1 = Llb_NonlinNextPartitions(::p,&pPart2,(Llb_Prt_t **)&bFunc), iVar1 != 0) {
    aVar4 = Abc_Clock();
    iVar1 = Cudd_ReadReorderings(::p->dd);
    iVar2 = Llb_NonlinQuantify2(::p,pPart2,(Llb_Prt_t *)bFunc);
    if (iVar2 == 0) {
      Llb_NonlinFree(::p);
      return (DdNode *)0x0;
    }
    aVar5 = Abc_Clock();
    timeAndEx = (aVar5 - aVar4) + timeAndEx;
    aVar5 = Abc_Clock();
    clk._4_4_ = clk._4_4_ + ((int)aVar5 - (int)aVar4);
    iVar2 = Cudd_ReadReorderings(::p->dd);
    if (iVar1 < iVar2) {
      Llb_NonlinRecomputeScores(::p);
    }
  }
  bTemp = Cudd_ReadOne(::p->dd);
  Cudd_Ref(bTemp);
  timeInside = 0;
  do {
    if (::p->iPartFree <= timeInside) {
      nSuppMax = ::p->nSuppMax;
      aVar4 = Abc_Clock();
      timeOther = ((aVar4 - aVar3) - (long)clk._4_4_) + timeOther;
      Cudd_Deref(bTemp);
      return bTemp;
    }
    pPart1 = Llb_MgrPart(::p,timeInside);
    if (pPart1 != (Llb_Prt_t *)0x0) {
      n = Cudd_bddAnd(::p->dd,bTemp,pPart1->bFunc);
      if (n == (DdNode *)0x0) {
        Cudd_RecursiveDeref(::p->dd,bTemp);
        Llb_NonlinFree(::p);
        return (DdNode *)0x0;
      }
      Cudd_Ref(n);
      Cudd_RecursiveDeref(::p->dd,bTemp);
      bTemp = n;
    }
    timeInside = timeInside + 1;
  } while( true );
}

Assistant:

DdNode * Llb_NonlinImageCompute( DdNode * bCurrent, int fReorder, int fDrop, int fVerbose, int * pOrder )
{
    Llb_Prt_t * pPart, * pPart1, * pPart2;
    DdNode * bFunc, * bTemp;
    int i, nReorders, timeInside = 0;
    abctime clk = Abc_Clock(), clk2;

    // add partition
    Llb_NonlinAddPartition( p, p->iPartFree++, bCurrent );
    // remove singles
    Llb_MgrForEachPart( p, pPart, i )
        if ( Llb_NonlinHasSingletonVars(p, pPart) )
            Llb_NonlinQuantify1( p, pPart, 0 );
    // reorder
    if ( fReorder )
        Llb_NonlinReorder( p->dd, 0, 0 );
    // save permutation
    memcpy( pOrder, p->dd->invperm, sizeof(int) * p->dd->size );

    // compute scores
    Llb_NonlinRecomputeScores( p );
    // iteratively quantify variables
    while ( Llb_NonlinNextPartitions(p, &pPart1, &pPart2) )
    {
        clk2 = Abc_Clock();
        nReorders = Cudd_ReadReorderings(p->dd);
        if ( !Llb_NonlinQuantify2( p, pPart1, pPart2 ) )
        {
            Llb_NonlinFree( p );
            return NULL;
        }
        timeAndEx  += Abc_Clock() - clk2;
        timeInside += Abc_Clock() - clk2;
        if ( nReorders < Cudd_ReadReorderings(p->dd) )
            Llb_NonlinRecomputeScores( p );
//        else
//            Llb_NonlinVerifyScores( p );
    }
    // load partitions
    bFunc = Cudd_ReadOne(p->dd);   Cudd_Ref( bFunc );
    Llb_MgrForEachPart( p, pPart, i )
    {
        bFunc = Cudd_bddAnd( p->dd, bTemp = bFunc, pPart->bFunc );
        if ( bFunc == NULL )
        {
            Cudd_RecursiveDeref( p->dd, bTemp );
            Llb_NonlinFree( p );
            return NULL;
        }
        Cudd_Ref( bFunc );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
    nSuppMax = p->nSuppMax;
    // reorder variables
//    if ( fReorder )
//        Llb_NonlinReorder( p->dd, 0, fVerbose );
    // save permutation
//    memcpy( pOrder, p->dd->invperm, sizeof(int) * Cudd_ReadSize(p->dd) );

    timeOther += Abc_Clock() - clk - timeInside;
    // return
    Cudd_Deref( bFunc );
    return bFunc;
}